

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztransfer.h
# Opt level: O0

void __thiscall
TPZTransfer<std::complex<float>_>::TPZTransfer
          (TPZTransfer<std::complex<float>_> *this,TPZTransfer<std::complex<float>_> *cp)

{
  long in_RSI;
  TPZBlock *in_RDI;
  TPZManVector<std::complex<float>,_10> *in_stack_00000008;
  TPZManVector<std::complex<float>,_10> *in_stack_00000010;
  TPZMatrix<std::complex<float>_> *in_stack_ffffffffffffffa0;
  TPZVec<int> *in_stack_ffffffffffffffa8;
  TPZMatrix<std::complex<float>_> *in_stack_ffffffffffffffb0;
  TPZVec<int> *this_00;
  TPZBlock *in_stack_ffffffffffffffb8;
  int64_t *bl;
  TPZManVector<int,_10> *copy;
  TPZManVector<int,_10> *in_stack_ffffffffffffffd0;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZTransfer<std::complex<float>>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  TPZMatrix<std::complex<float>_>::TPZMatrix
            (in_stack_ffffffffffffffb0,&in_stack_ffffffffffffffa8->_vptr_TPZVec,
             in_stack_ffffffffffffffa0);
  (in_RDI->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TPZTransfer_023eec30;
  *(undefined4 *)((long)&(in_RDI->fBlock).super_TPZVec<TPZBlock::TNode>.fNElements + 4) =
       *(undefined4 *)(in_RSI + 0x1c);
  copy = (TPZManVector<int,_10> *)&(in_RDI->fBlock).super_TPZVec<TPZBlock::TNode>.fNAlloc;
  TPZBlock::TPZBlock(in_RDI,in_stack_ffffffffffffffb8);
  bl = &in_RDI[1].fBlock.super_TPZVec<TPZBlock::TNode>.fNAlloc;
  TPZBlock::TPZBlock(in_RDI,(TPZBlock *)bl);
  this_00 = (TPZVec<int> *)&in_RDI[2].fBlock.super_TPZVec<TPZBlock::TNode>.fNAlloc;
  TPZVec<int>::TPZVec(this_00,in_stack_ffffffffffffffa8);
  TPZVec<int>::TPZVec(this_00,(TPZVec<int> *)&in_RDI[2].fBlock.fExtAlloc[1].pos);
  TPZManVector<int,_10>::TPZManVector((TPZManVector<int,_10> *)in_RDI,(int64_t)bl);
  TPZManVector<int,_10>::TPZManVector(in_stack_ffffffffffffffd0,copy);
  *(undefined4 *)&in_RDI[3].fBlock.super_TPZVec<TPZBlock::TNode>.fNAlloc =
       *(undefined4 *)(in_RSI + 0x290);
  TPZManVector<std::complex<float>,_10>::TPZManVector(in_stack_00000010,in_stack_00000008);
  *(undefined4 *)&in_RDI[3].fBlock.fExtAlloc[7].super_TPZSavable._vptr_TPZSavable =
       *(undefined4 *)(in_RSI + 0x308);
  return;
}

Assistant:

TPZTransfer(const TPZTransfer &cp) : TPZRegisterClassId(&TPZTransfer::ClassId),
    TPZMatrix<TVar>(cp),
	fNTVarVar(cp.fNTVarVar), fRowBlock(cp.fRowBlock),
	fColBlock(cp.fColBlock),fColPosition(cp.fColPosition),
	fNumberofColumnBlocks(cp.fNumberofColumnBlocks),
	fColumnBlockNumber(cp.fColumnBlockNumber),
	fColumnBlockLastUsed(cp.fColumnBlockLastUsed),
	fDoubleValues(cp.fDoubleValues),
	fDoubleValLastUsed(cp.fDoubleValLastUsed)
	{
	}